

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O2

int grisu3_round_weed(char *buffer,int len,uint64_t wp_W,uint64_t delta,uint64_t rest,
                     uint64_t ten_kappa,uint64_t ulp)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = ulp + wp_W;
  uVar3 = wp_W - ulp;
  uVar4 = delta - rest;
  uVar5 = uVar3 - rest;
  while( true ) {
    bVar6 = uVar4 < ten_kappa;
    if ((uVar3 <= rest) || (bVar7 = uVar4 < ten_kappa, uVar4 = uVar4 - ten_kappa, bVar7))
    goto LAB_001209b3;
    if ((uVar3 <= rest + ten_kappa) && (uVar5 < ((ulp + ten_kappa) - wp_W) + rest)) break;
    buffer[(long)len + -1] = buffer[(long)len + -1] + -1;
    uVar5 = uVar5 - ten_kappa;
    rest = rest + ten_kappa;
  }
  bVar6 = false;
LAB_001209b3:
  if (((bool)(uVar1 <= rest | bVar6)) ||
     ((uVar2 = 0, uVar1 <= ten_kappa + rest && (uVar1 - rest <= (ten_kappa - uVar1) + rest)))) {
    uVar2 = (uint)(rest <= delta + ulp * -4 && ulp * 2 <= rest);
  }
  return uVar2;
}

Assistant:

static int grisu3_round_weed(char *buffer, int len, uint64_t wp_W, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t ulp)
{
    uint64_t wp_Wup = wp_W - ulp;
    uint64_t wp_Wdown = wp_W + ulp;
    while(rest < wp_Wup && delta - rest >= ten_kappa
        && (rest + ten_kappa < wp_Wup || wp_Wup - rest >= rest + ten_kappa - wp_Wup))
    {
        --buffer[len-1];
        rest += ten_kappa;
    }
    if (rest < wp_Wdown && delta - rest >= ten_kappa
        && (rest + ten_kappa < wp_Wdown || wp_Wdown - rest > rest + ten_kappa - wp_Wdown))
        return 0;

    return 2*ulp <= rest && rest <= delta - 4*ulp;
}